

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::~GC(GC *this)

{
  long in_RDI;
  deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_> *in_stack_00000030;
  GenInfo *in_stack_ffffffffffffffe8;
  GC *in_stack_fffffffffffffff0;
  
  DestroyGeneration(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  DestroyGeneration(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  DestroyGeneration(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::ofstream::~ofstream((void *)(in_RDI + 0xe0));
  std::function<void_(luna::GCObject_*,_unsigned_int)>::~function
            ((function<void_(luna::GCObject_*,_unsigned_int)> *)0x135fa5);
  std::deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::~deque(in_stack_00000030);
  std::function<void_(luna::GCObjectVisitor_*)>::~function
            ((function<void_(luna::GCObjectVisitor_*)> *)0x135fc1);
  std::function<void_(luna::GCObjectVisitor_*)>::~function
            ((function<void_(luna::GCObjectVisitor_*)> *)0x135fcf);
  return;
}

Assistant:

GC::~GC()
    {
        DestroyGeneration(gen0_);
        DestroyGeneration(gen1_);
        DestroyGeneration(gen2_);
    }